

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::argSynopsis
          (CommandLine<Catch::ConfigData> *this,ostream *os)

{
  bool bVar1;
  pointer ppVar2;
  pointer pAVar3;
  ostream *poVar4;
  logic_error *this_00;
  ostream *in_RSI;
  long in_RDI;
  const_iterator it;
  int i;
  map<int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::less<int>,_std::allocator<std::pair<const_int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
  *in_stack_ffffffffffffff98;
  unique_ptr<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
  *in_stack_ffffffffffffffa0;
  _Self local_28;
  _Self local_20;
  int local_14;
  ostream *local_10;
  
  local_14 = 1;
  local_10 = in_RSI;
  do {
    if (*(int *)(in_RDI + 0x58) < local_14) {
      pAVar3 = std::
               unique_ptr<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
               ::get(in_stack_ffffffffffffffa0);
      if (pAVar3 != (pointer)0x0) {
        if (1 < *(int *)(in_RDI + 0x58)) {
          std::operator<<(local_10," ");
        }
        poVar4 = std::operator<<(local_10,"[<");
        pAVar3 = std::
                 unique_ptr<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
                 ::operator->((unique_ptr<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
                               *)0x1da01d);
        poVar4 = std::operator<<(poVar4,(string *)
                                        &(pAVar3->super_CommonArgProperties<Catch::ConfigData>).
                                         placeholder);
        std::operator<<(poVar4,"> ...]");
      }
      return;
    }
    if (1 < local_14) {
      std::operator<<(local_10," ");
    }
    local_20._M_node =
         (_Base_ptr)
         std::
         map<int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::less<int>,_std::allocator<std::pair<const_int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
         ::find(in_stack_ffffffffffffff98,(key_type *)0x1d9e8d);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::less<int>,_std::allocator<std::pair<const_int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
         ::end(in_stack_ffffffffffffff98);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (bVar1) {
      poVar4 = std::operator<<(local_10,"<");
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
                             *)0x1d9eda);
      poVar4 = std::operator<<(poVar4,(string *)
                                      &(ppVar2->second).super_CommonArgProperties<Catch::ConfigData>
                                       .placeholder);
      std::operator<<(poVar4,">");
    }
    else {
      pAVar3 = std::
               unique_ptr<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
               ::get(in_stack_ffffffffffffffa0);
      if (pAVar3 == (pointer)0x0) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (this_00,"non consecutive positional arguments with no floating args");
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      poVar4 = std::operator<<(local_10,"<");
      pAVar3 = std::
               unique_ptr<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
               ::operator->((unique_ptr<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
                             *)0x1d9f3b);
      poVar4 = std::operator<<(poVar4,(string *)
                                      &(pAVar3->super_CommonArgProperties<Catch::ConfigData>).
                                       placeholder);
      std::operator<<(poVar4,">");
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

void argSynopsis( std::ostream& os ) const {
            for( int i = 1; i <= m_highestSpecifiedArgPosition; ++i ) {
                if( i > 1 )
                    os << " ";
                typename std::map<int, Arg>::const_iterator it = m_positionalArgs.find( i );
                if( it != m_positionalArgs.end() )
                    os << "<" << it->second.placeholder << ">";
                else if( m_floatingArg.get() )
                    os << "<" << m_floatingArg->placeholder << ">";
                else
                    throw std::logic_error( "non consecutive positional arguments with no floating args" );
            }
            // !TBD No indication of mandatory args
            if( m_floatingArg.get() ) {
                if( m_highestSpecifiedArgPosition > 1 )
                    os << " ";
                os << "[<" << m_floatingArg->placeholder << "> ...]";
            }
        }